

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O0

void __thiscall ProgressBar::~ProgressBar(ProgressBar *this)

{
  ProgressBar *this_local;
  
  std::__cxx11::string::~string((string *)&this->pre_message_);
  std::__cxx11::string::~string((string *)&this->post_message_);
  return;
}

Assistant:

ProgressBar() {}